

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleAttributeCase::verifyImage
          (TriangleAttributeCase *this,ConstPixelBufferAccess *testImageAccess,
          ConstPixelBufferAccess *referenceImageAccess)

{
  ConstPixelBufferAccess *ref;
  ConstPixelBufferAccess *test;
  bool bVar1;
  int iVar2;
  RenderTarget *this_00;
  MessageBuilder *pMVar3;
  TestLog *pTVar4;
  float threshold;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  LogImage local_970;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  LogImage local_890;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  LogImage local_7b0;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  LogImageSet local_6d0;
  MessageBuilder local_690;
  PixelBufferAccess local_510;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  MessageBuilder local_1d8;
  undefined1 local_58 [8];
  Surface diffMask;
  int local_38;
  int faultyPixels;
  int faultyLimit;
  int kernelRadius;
  TestLog *log;
  ConstPixelBufferAccess *pCStack_20;
  bool msaa;
  ConstPixelBufferAccess *referenceImageAccess_local;
  ConstPixelBufferAccess *testImageAccess_local;
  TriangleAttributeCase *this_local;
  
  pCStack_20 = referenceImageAccess;
  referenceImageAccess_local = testImageAccess;
  testImageAccess_local = (ConstPixelBufferAccess *)this;
  this_00 = Context::getRenderTarget
                      ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.m_context)
  ;
  iVar2 = tcu::RenderTarget::getNumSamples(this_00);
  log._7_1_ = 1 < iVar2;
  _faultyLimit = tcu::TestContext::getLog
                           ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.
                            super_TestCase.super_TestNode.m_testCtx);
  if ((log._7_1_ & 1) == 0) {
    faultyPixels = 1;
    local_38 = 6;
    tcu::Surface::Surface((Surface *)local_58,200,200);
    tcu::TestLog::operator<<(&local_1d8,_faultyLimit,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [21])"Comparing images... ");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    tcu::TestLog::operator<<(&local_368,_faultyLimit,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_368,(char (*) [28])"Deviation within radius of ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&faultyPixels);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" is allowed.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
    tcu::TestLog::operator<<(&local_4e8,_faultyLimit,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_4e8,&stack0xffffffffffffffc8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [28])" faulty pixels are allowed.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e8);
    test = referenceImageAccess_local;
    ref = pCStack_20;
    pTVar4 = _faultyLimit;
    tcu::Surface::getAccess(&local_510,(Surface *)local_58);
    diffMask.m_pixels.m_cap._4_4_ = compareColoredImages(pTVar4,test,ref,&local_510,1);
    pTVar4 = _faultyLimit;
    if (6 < diffMask.m_pixels.m_cap._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"Images",&local_6f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_718,"Image comparison",&local_719);
      tcu::LogImageSet::LogImageSet(&local_6d0,&local_6f0,&local_718);
      pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7d0,"TestImage",&local_7d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f8,"Test image",&local_7f9);
      tcu::LogImage::LogImage
                (&local_7b0,&local_7d0,&local_7f8,referenceImageAccess_local,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b0,"ReferenceImage",&local_8b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8d8,"Reference image",&local_8d9);
      tcu::LogImage::LogImage
                (&local_890,&local_8b0,&local_8d8,pCStack_20,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_890);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_990,"DifferenceMask",&local_991);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9b8,"Difference mask",&local_9b9);
      tcu::Surface::getAccess((PixelBufferAccess *)&stack0xfffffffffffff618,(Surface *)local_58);
      tcu::LogImage::LogImage
                (&local_970,&local_990,&local_9b8,(ConstPixelBufferAccess *)&stack0xfffffffffffff618
                 ,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_970);
      pTVar4 = tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::TestLog::operator<<(&local_690,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_690,(char (*) [5])0x129c9b9);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&diffMask.m_pixels.m_cap + 4));
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])" faulty pixel(s).");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_690);
      tcu::LogImage::~LogImage(&local_970);
      std::__cxx11::string::~string((string *)&local_9b8);
      std::allocator<char>::~allocator(&local_9b9);
      std::__cxx11::string::~string((string *)&local_990);
      std::allocator<char>::~allocator(&local_991);
      tcu::LogImage::~LogImage(&local_890);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::allocator<char>::~allocator(&local_8d9);
      std::__cxx11::string::~string((string *)&local_8b0);
      std::allocator<char>::~allocator(&local_8b1);
      tcu::LogImage::~LogImage(&local_7b0);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::allocator<char>::~allocator(&local_7f9);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::allocator<char>::~allocator(&local_7d1);
      tcu::LogImageSet::~LogImageSet(&local_6d0);
      std::__cxx11::string::~string((string *)&local_718);
      std::allocator<char>::~allocator(&local_719);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::allocator<char>::~allocator(&local_6f1);
      tcu::TestContext::setTestResult
                ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
    }
    tcu::Surface::~Surface((Surface *)local_58);
  }
  else {
    bVar1 = tcu::fuzzyCompare(_faultyLimit,"Images","",pCStack_20,referenceImageAccess_local,0.3,
                              COMPARE_LOG_ON_ERROR);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TriangleCaseBase).super_RenderTestCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
    }
  }
  return;
}

Assistant:

void TriangleAttributeCase::verifyImage (const tcu::ConstPixelBufferAccess& testImageAccess, const tcu::ConstPixelBufferAccess& referenceImageAccess)
{
	const bool		msaa	= m_context.getRenderTarget().getNumSamples() > 1;
	tcu::TestLog&	log		= m_testCtx.getLog();

	if (!msaa)
	{
		const int		kernelRadius	= 1;
		const int		faultyLimit		= 6;
		int				faultyPixels;
		tcu::Surface	diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;
		log << TestLog::Message << faultyLimit << " faulty pixels are allowed." << TestLog::EndMessage;
		faultyPixels = compareColoredImages(log, testImageAccess, referenceImageAccess, diffMask.getAccess(), kernelRadius);

		if (faultyPixels > faultyLimit)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testImageAccess)
				<< TestLog::Image("ReferenceImage", "Reference image", referenceImageAccess)
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
	else
	{
		const float threshold = 0.3f;
		if (!tcu::fuzzyCompare(log, "Images", "", referenceImageAccess, testImageAccess, threshold, tcu::COMPARE_LOG_ON_ERROR))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}